

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void test<unsigned_long>(bool shouldBeValid,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  AssertHelper local_e8;
  Message local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  unsigned_long result2;
  Message local_98;
  string local_90;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58 [3];
  Message local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  unsigned_long result;
  string *psStack_18;
  bool valid;
  string *value_local;
  bool shouldBeValid_local;
  
  psStack_18 = value;
  value_local._7_1_ = shouldBeValid;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::c_str();
  lVar5 = std::__cxx11::string::size();
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       jsteemann::atoi<unsigned_long>(pcVar3,(char *)(lVar4 + lVar5),(bool *)((long)&result + 7));
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_38,"shouldBeValid","valid",(bool *)((long)&value_local + 7),
             (bool *)((long)&result + 7));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar2) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  pbVar1 = psStack_18;
  if ((gtest_ar_1.message_.ptr_._4_4_ == 0) && ((value_local._7_1_ & 1) != 0)) {
    std::__cxx11::to_string(&local_90,(unsigned_long)gtest_ar.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_70,"value","std::to_string(result)",pbVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar2) {
      testing::Message::Message(&local_98);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&result2,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                 ,0xe,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&result2,&local_98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result2);
      testing::Message::~Message(&local_98);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      lVar5 = std::__cxx11::string::size();
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           jsteemann::atoi_unchecked<unsigned_long>(pcVar3,(char *)(lVar4 + lVar5));
      pbVar1 = psStack_18;
      std::__cxx11::to_string(&local_d8,(unsigned_long)gtest_ar_2.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_b8,"value","std::to_string(result2)",pbVar1,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar2) {
        testing::Message::Message(&local_e0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp"
                   ,0x10,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    }
  }
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}